

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void __thiscall
EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
          (EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *this)

{
  key_type *in_RDI;
  HashObject<8,_8> *this_00;
  key_equal *in_stack_ffffffffffffffd8;
  hasher *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  *in_stack_fffffffffffffff0;
  
  this_00 = (HashObject<8,_8> *)&stack0xfffffffffffffff5;
  google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>::
  libc_allocator_with_realloc
            ((libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_> *)this_00);
  google::
  sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::sparse_hash_map(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffd8,(allocator_type *)this_00);
  google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>::
  ~libc_allocator_with_realloc
            ((libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_> *)
             &stack0xfffffffffffffff5);
  HashObject<8,_8>::HashObject(this_00,(int)((ulong)in_RDI >> 0x20));
  google::
  sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::set_deleted_key((sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                     *)this_00,in_RDI);
  return;
}

Assistant:

EasyUseSparseHashMap() { this->set_deleted_key(-1); }